

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
tracing_layer::zeMemOpenIpcHandle
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_ipc_mem_handle_t handle,
          ze_ipc_memory_flags_t flags,void **pptr)

{
  _func_void__ze_mem_open_ipc_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var1;
  _ze_ipc_mem_handle_t _Var2;
  _func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr__ze_ipc_mem_handle_t_uint_void_ptr_ptr
  *p_Var3;
  _ze_device_handle_t *p_Var4;
  ze_device_handle_t p_Var5;
  char *pcVar6;
  undefined1 *puVar7;
  ulong *puVar8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_158;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_140;
  undefined1 local_128 [8];
  APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_pfnMemOpenIpcHandleCb_t epilogue_callback_ptr;
  ze_pfnMemOpenIpcHandleCb_t prologueCallbackPtr;
  size_t i;
  tracer_array_t *currentTracerArray;
  APITracerCallbackDataImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  ze_mem_open_ipc_handle_params_t tracerParams;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ze_pfnMemOpenIpcHandle_t pfnOpenIpcHandle;
  void **pptr_local;
  ze_device_handle_t p_Stack_20;
  ze_ipc_memory_flags_t flags_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  if (_DAT_002da628 ==
      (_func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr__ze_ipc_mem_handle_t_uint_void_ptr_ptr
       *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pfnOpenIpcHandle = (ze_pfnMemOpenIpcHandle_t)pptr;
    pptr_local._4_4_ = flags;
    p_Stack_20 = hDevice;
    hDevice_local = (ze_device_handle_t)hContext;
    pcVar6 = (char *)tracingInProgress();
    p_Var5 = hDevice_local;
    p_Var4 = p_Stack_20;
    p_Var3 = _DAT_002da628;
    if (*pcVar6 == '\0') {
      puVar7 = (undefined1 *)tracingInProgress();
      *puVar7 = 1;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&hDevice_local;
      tracerParams.phContext = (ze_context_handle_t *)&stack0xffffffffffffffe0;
      tracerParams.phandle = (ze_ipc_mem_handle_t *)((long)&pptr_local + 4);
      tracerParams.pflags = (ze_ipc_memory_flags_t *)&pfnOpenIpcHandle;
      tracerParams.phDevice = (ze_device_handle_t *)&handle;
      APITracerCallbackDataImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
      puVar8 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar8 != (ulong *)0x0) {
        for (prologueCallbackPtr = (ze_pfnMemOpenIpcHandleCb_t)0x0;
            prologueCallbackPtr < (ze_pfnMemOpenIpcHandleCb_t)*puVar8;
            prologueCallbackPtr = prologueCallbackPtr + 1) {
          epilogCallback.pUserData =
               *(void **)(puVar8[1] + (long)prologueCallbackPtr * 0xcb8 + 0x528);
          p_Var1 = *(_func_void__ze_mem_open_ipc_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)(puVar8[1] + (long)prologueCallbackPtr * 0xcb8 + 0xb80);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData,(value_type *)&epilogCallback.pUserData);
          epilogCallback.current_api_callback =
               *(_func_void__ze_mem_open_ipc_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)(puVar8[1] + 0xcb0 + (long)prologueCallbackPtr * 0xcb8);
          local_128 = (undefined1  [8])p_Var1;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData.prologCallbacks.
                          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_128
                     );
        }
      }
      p_Var3 = _DAT_002da628;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_140,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_158,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData.prologCallbacks.
                   super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      hContext_local._4_4_ =
           APITracerWrapperImp<_ze_result_t(*)(_ze_context_handle_t*,_ze_device_handle_t*,_ze_ipc_mem_handle_t,unsigned_int,void**),_ze_mem_open_ipc_handle_params_t*,void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>>>,_ze_context_handle_t*&,_ze_device_handle_t*&,_ze_ipc_mem_handle_t&,unsigned_int&,void**&>
                     (p_Var3,(_ze_mem_open_ipc_handle_params_t *)
                             &apiCallbackData.epilogCallbacks.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_func_void__ze_mem_open_ipc_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                       *)currentTracerArray,&local_140,&local_158,
                      (_ze_context_handle_t **)
                      apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_ze_device_handle_t **)tracerParams.phContext,
                      (_ze_ipc_mem_handle_t *)tracerParams.phDevice,(uint *)tracerParams.phandle,
                      (void ***)tracerParams.pflags);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_158);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_140);
      APITracerCallbackDataImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
    }
    else {
      memcpy(&tracerParams.ppptr,&handle,0x40);
      _Var2.data._8_8_ = uStack_70;
      _Var2.data._0_8_ = tracerParams.ppptr;
      _Var2.data._16_8_ = local_68;
      _Var2.data._24_8_ = uStack_60;
      _Var2.data._32_8_ = local_58;
      _Var2.data._40_8_ = uStack_50;
      _Var2.data._48_8_ = local_48;
      _Var2.data._56_8_ = uStack_40;
      hContext_local._4_4_ =
           (*p_Var3)((_ze_context_handle_t *)p_Var5,p_Var4,_Var2,pptr_local._4_4_,
                     (void **)pfnOpenIpcHandle);
    }
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemOpenIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device to associate with the IPC memory handle
        ze_ipc_mem_handle_t handle,                     ///< [in] IPC memory handle
        ze_ipc_memory_flags_t flags,                    ///< [in] flags controlling the operation.
                                                        ///< must be 0 (default) or a valid combination of ::ze_ipc_memory_flag_t.
        void** pptr                                     ///< [out] pointer to device allocation in this process
        )
    {
        auto pfnOpenIpcHandle = context.zeDdiTable.Mem.pfnOpenIpcHandle;

        if( nullptr == pfnOpenIpcHandle)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Mem.pfnOpenIpcHandle, hContext, hDevice, handle, flags, pptr);

        // capture parameters
        ze_mem_open_ipc_handle_params_t tracerParams = {
            &hContext,
            &hDevice,
            &handle,
            &flags,
            &pptr
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnMemOpenIpcHandleCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnMemOpenIpcHandleCb_t, Mem, pfnOpenIpcHandleCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Mem.pfnOpenIpcHandle,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phContext,
                                                  *tracerParams.phDevice,
                                                  *tracerParams.phandle,
                                                  *tracerParams.pflags,
                                                  *tracerParams.ppptr);
    }